

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void R_InitRenderer(void)

{
  addterm(R_ShutdownRenderer,"R_ShutdownRenderer");
  memset(zeroarray,0,0x2d00);
  R_InitPlanes();
  R_InitShadeMaps();
  R_InitColumnDrawers();
  basecolfunc = R_DrawColumn;
  colfunc = R_DrawColumn;
  fuzzcolfunc = R_DrawFuzzColumn;
  transcolfunc = R_DrawTranslatedColumn;
  spanfunc = R_DrawSpan;
  hcolfunc_pre = R_DrawColumnHoriz;
  hcolfunc_post1 = rt_map1col_c;
  hcolfunc_post4 = rt_map4cols;
  return;
}

Assistant:

void R_InitRenderer()
{
	atterm(R_ShutdownRenderer);
	// viewwidth / viewheight are set by the defaults
	clearbufshort (zeroarray, MAXWIDTH, 0);

	R_InitPlanes ();
	R_InitShadeMaps();
	R_InitColumnDrawers ();

	colfunc = basecolfunc = R_DrawColumn;
	fuzzcolfunc = R_DrawFuzzColumn;
	transcolfunc = R_DrawTranslatedColumn;
	spanfunc = R_DrawSpan;

	// [RH] Horizontal column drawers
	hcolfunc_pre = R_DrawColumnHoriz;
	hcolfunc_post1 = rt_map1col;
	hcolfunc_post4 = rt_map4cols;
}